

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

int Abc_ExactDelayCost(word *pTruth,int nVars,int *pArrTimeProfile,char *pPerm,int *Cost,
                      int AigLevel)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  char *pcVar4;
  abctime aVar5;
  int local_bc;
  int Delay2;
  abctime timeStartExact;
  abctime timeStart;
  int local_a0;
  int fResLimit;
  int nMaxDepth;
  int Delay;
  int pNormalArrTime [8];
  char *local_70;
  char *p;
  char *pSol2;
  char *pSol;
  Ses_Man_t *pSes;
  int local_48;
  int l;
  int nDelta;
  int nMaxArrival;
  int i;
  int AigLevel_local;
  int *Cost_local;
  char *pPerm_local;
  int *pArrTimeProfile_local;
  word *pwStack_18;
  int nVars_local;
  word *pTruth_local;
  
  pSol = (char *)0x0;
  pSol2 = (char *)0x0;
  nMaxArrival = AigLevel;
  _i = Cost;
  Cost_local = (int *)pPerm;
  pPerm_local = (char *)pArrTimeProfile;
  pArrTimeProfile_local._4_4_ = nVars;
  pwStack_18 = pTruth;
  aVar2 = Abc_Clock();
  if (((int)pArrTimeProfile_local._4_4_ < 0) || (8 < (int)pArrTimeProfile_local._4_4_)) {
    printf("invalid truth table size %d\n",(ulong)pArrTimeProfile_local._4_4_);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0xaa9,"int Abc_ExactDelayCost(word *, int, int *, char *, int *, int)");
  }
  s_pSesStore->nCutCount = s_pSesStore->nCutCount + 1;
  s_pSesStore->pCutCount[(int)pArrTimeProfile_local._4_4_] =
       s_pSesStore->pCutCount[(int)pArrTimeProfile_local._4_4_] + 1;
  if (pArrTimeProfile_local._4_4_ == 0) {
    s_pSesStore->nSynthesizedTrivial = s_pSesStore->nSynthesizedTrivial + 1;
    s_pSesStore->pSynthesizedTrivial[0] = s_pSesStore->pSynthesizedTrivial[0] + 1;
    *_i = 0;
    aVar3 = Abc_Clock();
    s_pSesStore->timeTotal = (aVar3 - aVar2) + s_pSesStore->timeTotal;
    pTruth_local._4_4_ = 0;
  }
  else if (pArrTimeProfile_local._4_4_ == 1) {
    s_pSesStore->nSynthesizedTrivial = s_pSesStore->nSynthesizedTrivial + 1;
    s_pSesStore->pSynthesizedTrivial[1] = s_pSesStore->pSynthesizedTrivial[1] + 1;
    *_i = 0;
    *(undefined1 *)Cost_local = 0;
    aVar3 = Abc_Clock();
    s_pSesStore->timeTotal = (aVar3 - aVar2) + s_pSesStore->timeTotal;
    pTruth_local._4_4_ = *(int *)pPerm_local;
  }
  else {
    for (pSes._4_4_ = 0; pSes._4_4_ < (int)pArrTimeProfile_local._4_4_; pSes._4_4_ = pSes._4_4_ + 1)
    {
      (&nMaxDepth)[pSes._4_4_] = *(int *)(pPerm_local + (long)pSes._4_4_ * 4);
    }
    local_48 = Abc_NormalizeArrivalTimes(&nMaxDepth,pArrTimeProfile_local._4_4_,&l);
    *_i = 1000000000;
    iVar1 = Ses_StoreGetEntry(s_pSesStore,pwStack_18,pArrTimeProfile_local._4_4_,&nMaxDepth,&pSol2);
    if (iVar1 == 0) {
      if (s_pSesStore->fVeryVerbose != 0) {
        printf("\x1b[36m");
        Abc_TtPrintHexRev((FILE *)_stdout,pwStack_18,pArrTimeProfile_local._4_4_);
        printf("\x1b[0m");
        printf(" [%d",(ulong)(uint)nMaxDepth);
        for (pSes._4_4_ = 1; pSes._4_4_ < (int)pArrTimeProfile_local._4_4_;
            pSes._4_4_ = pSes._4_4_ + 1) {
          printf(" %d",(ulong)(uint)(&nMaxDepth)[pSes._4_4_]);
        }
        printf("]@%d:",(ulong)(uint)nMaxArrival);
        fflush(_stdout);
      }
      local_a0 = nMaxDepth;
      for (nDelta = 1; nDelta < (int)pArrTimeProfile_local._4_4_; nDelta = nDelta + 1) {
        local_a0 = Abc_MaxInt(local_a0,(&nMaxDepth)[nDelta]);
      }
      local_a0 = pArrTimeProfile_local._4_4_ + 1 + local_a0;
      if (nMaxArrival != -1) {
        local_a0 = Abc_MinInt(nMaxArrival - local_48,local_a0 + pArrTimeProfile_local._4_4_ + 1);
      }
      aVar3 = Abc_Clock();
      pSol = (char *)Ses_ManAlloc(pwStack_18,pArrTimeProfile_local._4_4_,1,local_a0,&nMaxDepth,
                                  s_pSesStore->fMakeAIG,s_pSesStore->nBTLimit,s_pSesStore->fVerbose)
      ;
      ((Ses_Man_t *)pSol)->fVeryVerbose = s_pSesStore->fVeryVerbose;
      ((Ses_Man_t *)pSol)->pSat = s_pSesStore->pSat;
      ((Ses_Man_t *)pSol)->nStartGates = pArrTimeProfile_local._4_4_ - 2;
      while (*(int *)(pSol + 0x24) != 0) {
        if (s_pSesStore->fVeryVerbose != 0) {
          printf(" %d",(ulong)*(uint *)(pSol + 0x24));
          fflush(_stdout);
        }
        pcVar4 = Ses_ManFindMinimumSize((Ses_Man_t *)pSol);
        if (pcVar4 == (char *)0x0) {
          if (s_pSesStore->fVeryVerbose != 0) {
            if (9 < *(int *)(pSol + 0x24)) {
              printf("\b");
            }
            pcVar4 = "\x1b[33m";
            if (*(int *)(pSol + 0x440) != 0) {
              pcVar4 = "\x1b[31m";
            }
            printf("\b%s%d\x1b[0m",pcVar4,(ulong)*(uint *)(pSol + 0x24));
          }
          break;
        }
        if (s_pSesStore->fVeryVerbose != 0) {
          if (9 < *(int *)(pSol + 0x24)) {
            printf("\b");
          }
          printf("\b\x1b[32m%d\x1b[0m",(ulong)*(uint *)(pSol + 0x24));
        }
        if ((pSol2 != (char *)0x0) && (pSol2 != (char *)0x0)) {
          free(pSol2);
        }
        *(int *)(pSol + 0x24) = *(int *)(pSol + 0x24) + -1;
        pSol2 = pcVar4;
      }
      if (s_pSesStore->fVeryVerbose != 0) {
        printf("        \n");
      }
      if ((s_pSesStore->pDebugEntries != (FILE *)0x0) && (*(int *)(pSol + 0x440) != 0)) {
        Ses_StorePrintDebugEntry
                  (s_pSesStore,pwStack_18,pArrTimeProfile_local._4_4_,&nMaxDepth,
                   *(int *)(pSol + 0x24),pSol2,pArrTimeProfile_local._4_4_ - 2);
      }
      aVar5 = Abc_Clock();
      *(abctime *)(pSol + 0x470) = aVar5 - aVar3;
      s_pSesStore->nSatCalls = (long)*(int *)(pSol + 0x478) + s_pSesStore->nSatCalls;
      s_pSesStore->nUnsatCalls = (long)*(int *)(pSol + 0x47c) + s_pSesStore->nUnsatCalls;
      s_pSesStore->nUndefCalls = (long)*(int *)(pSol + 0x480) + s_pSesStore->nUndefCalls;
      s_pSesStore->timeSat = *(long *)(pSol + 0x448) + s_pSesStore->timeSat;
      s_pSesStore->timeSatSat = *(long *)(pSol + 0x450) + s_pSesStore->timeSatSat;
      s_pSesStore->timeSatUnsat = *(long *)(pSol + 0x458) + s_pSesStore->timeSatUnsat;
      s_pSesStore->timeSatUndef = *(long *)(pSol + 0x460) + s_pSesStore->timeSatUndef;
      s_pSesStore->timeInstance = *(long *)(pSol + 0x468) + s_pSesStore->timeInstance;
      s_pSesStore->timeExact = *(long *)(pSol + 0x470) + s_pSesStore->timeExact;
      iVar1 = *(int *)(pSol + 0x440);
      Ses_ManCleanLight((Ses_Man_t *)pSol);
      Ses_StoreAddEntry(s_pSesStore,pwStack_18,pArrTimeProfile_local._4_4_,&nMaxDepth,pSol2,iVar1);
    }
    else {
      s_pSesStore->nCacheHits = s_pSesStore->nCacheHits + 1;
      s_pSesStore->pCacheHits[(int)pArrTimeProfile_local._4_4_] =
           s_pSesStore->pCacheHits[(int)pArrTimeProfile_local._4_4_] + 1;
    }
    if (pSol2 != (char *)0x0) {
      *_i = (int)pSol2[2];
      local_70 = pSol2 + (long)((int)pSol2[2] << 2) + 5;
      for (pSes._4_4_ = 0; pSes._4_4_ < (int)pArrTimeProfile_local._4_4_;
          pSes._4_4_ = pSes._4_4_ + 1) {
        *(char *)((long)Cost_local + (long)pSes._4_4_) = *local_70;
        local_70 = local_70 + 1;
      }
    }
    if (pSol2 == (char *)0x0) {
      if (*_i != 1000000000) {
        __assert_fail("*Cost == ABC_INFINITY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                      ,0xb46,"int Abc_ExactDelayCost(word *, int, int *, char *, int *, int)");
      }
      aVar3 = Abc_Clock();
      s_pSesStore->timeTotal = (aVar3 - aVar2) + s_pSesStore->timeTotal;
      pTruth_local._4_4_ = 1000000000;
    }
    else {
      local_bc = 0;
      for (pSes._4_4_ = 0; pSes._4_4_ < (int)pArrTimeProfile_local._4_4_;
          pSes._4_4_ = pSes._4_4_ + 1) {
        local_bc = Abc_MaxInt(local_bc,*(int *)(pPerm_local + (long)pSes._4_4_ * 4) +
                                       (int)*(char *)((long)Cost_local + (long)pSes._4_4_));
      }
      aVar3 = Abc_Clock();
      s_pSesStore->timeTotal = (aVar3 - aVar2) + s_pSesStore->timeTotal;
      pTruth_local._4_4_ = local_bc;
    }
  }
  return pTruth_local._4_4_;
}

Assistant:

int Abc_ExactDelayCost( word * pTruth, int nVars, int * pArrTimeProfile, char * pPerm, int * Cost, int AigLevel )
{
    int i, nMaxArrival, nDelta, l;
    Ses_Man_t * pSes = NULL;
    char * pSol = NULL, * pSol2 = NULL, * p;
    int pNormalArrTime[8];
    int Delay = ABC_INFINITY, nMaxDepth, fResLimit;
    abctime timeStart = Abc_Clock(), timeStartExact;

    /* some checks */
    if ( nVars < 0 || nVars > 8 )
    {
        printf( "invalid truth table size %d\n", nVars );
        assert( 0 );
    }

    /* statistics */
    s_pSesStore->nCutCount++;
    s_pSesStore->pCutCount[nVars]++;

    if ( nVars == 0 )
    {
        s_pSesStore->nSynthesizedTrivial++;
        s_pSesStore->pSynthesizedTrivial[0]++;

        *Cost = 0;
        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return 0;
    }

    if ( nVars == 1 )
    {
        s_pSesStore->nSynthesizedTrivial++;
        s_pSesStore->pSynthesizedTrivial[1]++;

        *Cost = 0;
        pPerm[0] = (char)0;
        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return pArrTimeProfile[0];
    }

    for ( l = 0; l < nVars; ++l )
        pNormalArrTime[l] = pArrTimeProfile[l];

    nDelta = Abc_NormalizeArrivalTimes( pNormalArrTime, nVars, &nMaxArrival );

    *Cost = ABC_INFINITY;

    if ( Ses_StoreGetEntry( s_pSesStore, pTruth, nVars, pNormalArrTime, &pSol ) )
    {
        s_pSesStore->nCacheHits++;
        s_pSesStore->pCacheHits[nVars]++;
    }
    else
    {
        if ( s_pSesStore->fVeryVerbose )
        {
            printf( ANSI_COLOR_CYAN );
            Abc_TtPrintHexRev( stdout, pTruth, nVars );
            printf( ANSI_COLOR_RESET );
            printf( " [%d", pNormalArrTime[0] );
            for ( l = 1; l < nVars; ++l )
                printf( " %d", pNormalArrTime[l] );
            printf( "]@%d:", AigLevel );
            fflush( stdout );
        }

        nMaxDepth = pNormalArrTime[0];
        for ( i = 1; i < nVars; ++i )
            nMaxDepth = Abc_MaxInt( nMaxDepth, pNormalArrTime[i] );
        nMaxDepth += nVars + 1;
        if ( AigLevel != -1 )
            nMaxDepth = Abc_MinInt( AigLevel - nDelta, nMaxDepth + nVars + 1 );

        timeStartExact = Abc_Clock();

        pSes = Ses_ManAlloc( pTruth, nVars, 1 /* nSpecFunc */, nMaxDepth, pNormalArrTime, s_pSesStore->fMakeAIG, s_pSesStore->nBTLimit, s_pSesStore->fVerbose );
        pSes->fVeryVerbose = s_pSesStore->fVeryVerbose;
        pSes->pSat = s_pSesStore->pSat;
        pSes->nStartGates = nVars - 2;

        while ( pSes->nMaxDepth ) /* there is improvement */
        {
            if ( s_pSesStore->fVeryVerbose )
            {
                printf( " %d", pSes->nMaxDepth );
                fflush( stdout );
            }

            if ( ( pSol2 = Ses_ManFindMinimumSize( pSes ) ) != NULL )
            {
                if ( s_pSesStore->fVeryVerbose )
                {
                    if ( pSes->nMaxDepth >= 10 ) printf( "\b" );
                    printf( "\b" ANSI_COLOR_GREEN "%d" ANSI_COLOR_RESET, pSes->nMaxDepth );
                }
                if ( pSol )
                    ABC_FREE( pSol );
                pSol = pSol2;
                pSes->nMaxDepth--;
            }
            else
            {
                if ( s_pSesStore->fVeryVerbose )
                {
                    if ( pSes->nMaxDepth >= 10 ) printf( "\b" );
                    printf( "\b%s%d" ANSI_COLOR_RESET, pSes->fHitResLimit ? ANSI_COLOR_RED : ANSI_COLOR_YELLOW, pSes->nMaxDepth );
                }
                break;
            }
        }

        if ( s_pSesStore->fVeryVerbose )
            printf( "        \n" );

        /* log unsuccessful case for debugging */
        if ( s_pSesStore->pDebugEntries && pSes->fHitResLimit )
            Ses_StorePrintDebugEntry( s_pSesStore, pTruth, nVars, pNormalArrTime, pSes->nMaxDepth, pSol, nVars - 2 );

        pSes->timeTotal = Abc_Clock() - timeStartExact;

        /* statistics */
        s_pSesStore->nSatCalls += pSes->nSatCalls;
        s_pSesStore->nUnsatCalls += pSes->nUnsatCalls;
        s_pSesStore->nUndefCalls += pSes->nUndefCalls;

        s_pSesStore->timeSat += pSes->timeSat;
        s_pSesStore->timeSatSat += pSes->timeSatSat;
        s_pSesStore->timeSatUnsat += pSes->timeSatUnsat;
        s_pSesStore->timeSatUndef += pSes->timeSatUndef;
        s_pSesStore->timeInstance += pSes->timeInstance;
        s_pSesStore->timeExact += pSes->timeTotal;

        /* cleanup (we need to clean before adding since pTruth may have been modified by pSes) */
        fResLimit = pSes->fHitResLimit;
        Ses_ManCleanLight( pSes );

        /* store solution */
        Ses_StoreAddEntry( s_pSesStore, pTruth, nVars, pNormalArrTime, pSol, fResLimit );
    }

    if ( pSol )
    {
        *Cost = pSol[ABC_EXACT_SOL_NGATES];
        p = pSol + 3 + 4 * pSol[ABC_EXACT_SOL_NGATES] + 1;
        Delay = *p++;
        for ( l = 0; l < nVars; ++l )
            pPerm[l] = *p++;
    }

    if ( pSol )
    {
        int Delay2 = 0;
        for ( l = 0; l < nVars; ++l )
        {
            //printf( "%d ", pPerm[l] );
            Delay2 = Abc_MaxInt( Delay2, pArrTimeProfile[l] + pPerm[l] );
        }
        //printf( "  output arrival = %d    recomputed = %d\n", Delay, Delay2 );
        //if ( Delay != Delay2 )
        //{
        //    printf( "^--- BUG!\n" );
        //    assert( 0 );
        //}

        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return Delay2;
    }
    else
    {
        assert( *Cost == ABC_INFINITY );

        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return ABC_INFINITY;
    }
}